

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool ON_BrepRemoveSlits(ON_BrepFace *F)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  TYPE TVar5;
  int iVar6;
  int *piVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  byte bVar12;
  TYPE TVar13;
  int **ppiVar14;
  long lVar15;
  ON_BrepLoop *pOVar16;
  ON_Brep *pOVar17;
  ON_BrepEdge *pOVar18;
  ON_BrepLoop *pOVar19;
  ON_Surface *pOVar20;
  double *pdVar21;
  ON_SimpleArray<int> *pOVar22;
  undefined8 extraout_RAX;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  ON_BrepTrim *pOVar29;
  ON_BrepTrim *pOVar30;
  _func_int **extraout_XMM0_Qa;
  bool *in_XMM1_Qa;
  ON_SimpleArray<bool> bUsed;
  ON_2dPoint AP;
  ON_ClassArray<ON_SimpleArray<int>_> NewLoops;
  ON_SimpleArray<int> slits;
  ON_SimpleArray<bool> bIsSlit;
  int local_144;
  ON_Brep *local_140;
  undefined1 local_138 [24];
  ON_BrepLoop *local_120;
  long local_118;
  ON_2dPoint local_110;
  uint local_fc;
  ON_ClassArray<ON_SimpleArray<int>_> local_f8;
  double local_e0;
  ON_BrepFace *local_d8;
  ON_BrepTrim *local_d0;
  undefined8 local_c8;
  long local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  _func_int **local_90;
  ON_BrepFace *local_88;
  ON_SimpleArray<int> local_80;
  ON_SimpleArray<bool> local_68;
  _func_int **local_50;
  _func_int **local_48;
  long local_40;
  ON_Brep *local_38;
  
  if ((F->m_face_index < 0) || (local_38 = ON_BrepFace::Brep(F), local_38 == (ON_Brep *)0x0)) {
    bVar12 = 0;
  }
  else {
    local_40 = (long)(F->m_li).m_count;
    bVar12 = 0;
    if (0 < local_40) {
      local_90 = (_func_int **)&PTR__ON_SimpleArray_008189b0;
      local_48 = (_func_int **)&PTR__ON_SimpleArray_008176a8;
      local_50 = (_func_int **)&PTR__ON_ClassArray_0081c7d8;
      local_c0 = 0;
      local_c8 = 0;
      local_d8 = F;
      do {
        iVar28 = (F->m_li).m_a[local_c0];
        pOVar16 = (local_38->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>
                  .m_a;
        if (-1 < pOVar16[iVar28].m_loop_index) {
          pOVar16 = pOVar16 + iVar28;
          local_88 = ON_BrepLoop::Face(pOVar16);
          if ((local_88 != (ON_BrepFace *)0x0) &&
             (local_140 = ON_BrepLoop::Brep(pOVar16), local_140 != (ON_Brep *)0x0)) {
            sVar25 = (size_t)(pOVar16->m_ti).m_count;
            local_68._vptr_ON_SimpleArray = local_90;
            local_68.m_a = (bool *)0x0;
            local_68.m_count = 0;
            local_68.m_capacity = 0;
            if (sVar25 != 0) {
              ON_SimpleArray<bool>::SetCapacity(&local_68,sVar25);
            }
            sVar25 = (size_t)(pOVar16->m_ti).m_count;
            local_80._vptr_ON_SimpleArray = local_48;
            ppiVar14 = &local_80.m_a;
            local_80.m_a = (int *)0x0;
            local_80.m_count = 0;
            local_80.m_capacity = 0;
            if (sVar25 != 0) {
              ppiVar14 = (int **)ON_SimpleArray<int>::SetCapacity(&local_80,sVar25);
            }
            uVar4 = (pOVar16->m_ti).m_count;
            uVar27 = (ulong)uVar4;
            uVar24 = CONCAT71((int7)((ulong)ppiVar14 >> 8),1);
            local_120 = pOVar16;
            if ((int)uVar4 < 1) {
              uVar23 = 0;
            }
            else {
              local_fc = (uint)uVar24;
              uVar24 = 0;
              local_98 = 0;
              do {
                lVar15 = (long)(local_120->m_ti).m_a[uVar24];
                local_d0 = (local_140->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                           super_ON_ClassArray<ON_BrepTrim>.m_a;
                local_118 = lVar15 * 0xe8;
                iVar28 = local_d0[lVar15].m_trim_index;
                if (iVar28 < 0) {
LAB_0041b9df:
                  local_138._0_8_ = local_138._0_8_ & 0xffffffffffffff00;
                  ON_SimpleArray<bool>::Append(&local_68,(bool *)local_138);
                  local_fc = 0;
                }
                else {
                  pOVar30 = local_d0 + lVar15;
                  pOVar16 = ON_BrepTrim::Loop(pOVar30);
                  if (((((pOVar16 == (ON_BrepLoop *)0x0) ||
                        (pOVar17 = ON_BrepTrim::Brep(pOVar30), pOVar17 == (ON_Brep *)0x0)) ||
                       (pOVar18 = ON_BrepTrim::Edge(pOVar30), pOVar18 == (ON_BrepEdge *)0x0)) ||
                      ((pOVar18->m_edge_index < 0 || ((pOVar18->m_ti).m_count != 2)))) ||
                     (piVar7 = (pOVar18->m_ti).m_a, lVar15 = (long)piVar7[*piVar7 == iVar28],
                     lVar15 < 0)) goto LAB_0041b9df;
                  pOVar29 = (pOVar17->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                            super_ON_ClassArray<ON_BrepTrim>.m_a;
                  if (pOVar29[lVar15].m_trim_index < 0) goto LAB_0041b9df;
                  pOVar29 = pOVar29 + lVar15;
                  pOVar19 = ON_BrepTrim::Loop(pOVar29);
                  if ((pOVar19 != pOVar16) ||
                     (pOVar20 = ON_BrepTrim::SurfaceOf(pOVar30), pOVar20 == (ON_Surface *)0x0))
                  goto LAB_0041b9df;
                  (*(pOVar20->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar20,0);
                  local_b8 = ON_Interval::Length((ON_Interval *)local_138);
                  local_b8 = local_b8 * 0.25;
                  (*(pOVar20->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar20,1);
                  local_138._0_8_ = extraout_XMM0_Qa;
                  local_138._8_8_ = in_XMM1_Qa;
                  local_e0 = ON_Interval::Length((ON_Interval *)local_138);
                  local_e0 = local_e0 * 0.25;
                  bVar2 = pOVar30->m_bRev3d;
                  bVar3 = pOVar29->m_bRev3d;
                  ON_Curve::PointAtStart((ON_3dPoint *)local_138,(ON_Curve *)pOVar30);
                  ON_2dPoint::ON_2dPoint((ON_2dPoint *)&local_f8,(ON_3dPoint *)local_138);
                  if (bVar2 == bVar3) {
                    ON_Curve::PointAtStart((ON_3dPoint *)local_138,(ON_Curve *)pOVar29);
                  }
                  else {
                    ON_Curve::PointAtEnd((ON_3dPoint *)local_138,(ON_Curve *)pOVar29);
                  }
                  ON_2dPoint::ON_2dPoint(&local_110,(ON_3dPoint *)local_138);
                  pdVar21 = ON_2dPoint::operator[]((ON_2dPoint *)&local_f8,0);
                  local_a8 = *pdVar21;
                  uStack_a0 = 0;
                  pdVar21 = ON_2dPoint::operator[](&local_110,0);
                  if (local_b8 < ABS(local_a8 - *pdVar21)) goto LAB_0041b9df;
                  pdVar21 = ON_2dPoint::operator[]((ON_2dPoint *)&local_f8,1);
                  local_a8 = *pdVar21;
                  uStack_a0 = 0;
                  pdVar21 = ON_2dPoint::operator[](&local_110,1);
                  if (local_e0 < ABS(local_a8 - *pdVar21)) goto LAB_0041b9df;
                  ON_Curve::PointAtEnd((ON_3dPoint *)local_138,(ON_Curve *)pOVar30);
                  ON_2dPoint::operator=((ON_2dPoint *)&local_f8,(ON_3dPoint *)local_138);
                  if (bVar2 == bVar3) {
                    ON_Curve::PointAtEnd((ON_3dPoint *)local_138,(ON_Curve *)pOVar29);
                  }
                  else {
                    ON_Curve::PointAtStart((ON_3dPoint *)local_138,(ON_Curve *)pOVar29);
                  }
                  ON_2dPoint::operator=(&local_110,(ON_3dPoint *)local_138);
                  pdVar21 = ON_2dPoint::operator[]((ON_2dPoint *)&local_f8,0);
                  local_a8 = *pdVar21;
                  uStack_a0 = 0;
                  pdVar21 = ON_2dPoint::operator[](&local_110,0);
                  if (local_b8 < ABS(local_a8 - *pdVar21)) goto LAB_0041b9df;
                  pdVar21 = ON_2dPoint::operator[]((ON_2dPoint *)&local_f8,1);
                  local_b8 = *pdVar21;
                  uStack_b0 = 0;
                  pdVar21 = ON_2dPoint::operator[](&local_110,1);
                  if (local_e0 < ABS(local_b8 - *pdVar21)) goto LAB_0041b9df;
                  local_138[0] = 1;
                  ON_SimpleArray<bool>::Append(&local_68,(bool *)local_138);
                  local_98 = CONCAT71((int7)((ulong)local_d0 >> 8),1);
                  ON_SimpleArray<int>::Append
                            (&local_80,(int *)((long)local_d0->m_vi + local_118 + -0xc));
                }
                uVar24 = uVar24 + 1;
              } while (uVar27 != uVar24);
              uVar24 = (ulong)local_fc;
              uVar23 = local_98;
            }
            pOVar16 = local_120;
            if ((uVar24 & 1) == 0) {
              F = local_d8;
              if ((uVar23 & 1) != 0) {
                local_138._0_8_ = local_90;
                local_138._8_8_ = (bool *)0x0;
                local_138._16_8_ = 0.0;
                ON_SimpleArray<bool>::operator=((ON_SimpleArray<bool> *)local_138,&local_68);
                local_f8._vptr_ON_ClassArray = local_50;
                local_f8.m_a = (ON_SimpleArray<int> *)0x0;
                local_f8.m_count = 0;
                local_f8.m_capacity = 0;
                local_118 = CONCAT71(local_118._1_7_,(int)uVar4 < 1);
                iVar28 = 0;
                do {
                  if ((int)uVar4 <= iVar28) goto LAB_0041bf02;
                  local_110.x._0_4_ = -1;
                  if (0 < (int)uVar4) {
                    uVar24 = 0;
                    do {
                      if (*(bool *)(local_138._8_8_ + uVar24) == false) {
                        local_110.x._0_4_ = (int)uVar24;
                        break;
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar27 != uVar24);
                  }
                  if (local_110.x._0_4_ < 0) {
                    bVar12 = 6;
                  }
                  else {
                    local_d0 = (ON_BrepTrim *)CONCAT44(local_d0._4_4_,iVar28);
                    pOVar22 = ON_ClassArray<ON_SimpleArray<int>_>::AppendNew(&local_f8);
                    ON_SimpleArray<int>::Append(pOVar22,(int *)&local_110);
                    local_144 = (local_110.x._0_4_ + 1) % (int)uVar4;
                    *(bool *)(local_138._8_8_ + (long)local_110.x._0_4_) = true;
                    bVar12 = (byte)local_118;
                    if (0 < (int)uVar4) {
                      iVar28 = 0;
                      do {
                        pOVar16 = local_120;
                        iVar6 = local_144;
                        lVar15 = (long)local_144;
                        if (*(bool *)(local_138._8_8_ + lVar15) == false) {
                          ON_SimpleArray<int>::Append(pOVar22,&local_144);
                          *(bool *)(local_138._8_8_ + (long)local_144) = true;
                          local_144 = (local_144 + 1) % (int)uVar4;
                          iVar28 = iVar28 + 1;
                        }
                        else {
                          if (local_144 == local_110.x._0_4_) break;
                          if (local_68.m_a[lVar15] == true) {
                            pOVar30 = (local_140->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                      super_ON_ClassArray<ON_BrepTrim>.m_a +
                                      (local_120->m_ti).m_a[lVar15];
                            pOVar18 = ON_BrepTrim::Edge(pOVar30);
                            piVar7 = (pOVar18->m_ti).m_a;
                            local_144 = -1;
                            uVar24 = 0;
                            do {
                              if ((pOVar16->m_ti).m_a[uVar24] ==
                                  piVar7[*piVar7 == pOVar30->m_trim_index]) {
                                local_144 = (int)uVar24;
                                break;
                              }
                              uVar24 = uVar24 + 1;
                            } while (uVar27 != uVar24);
                            iVar11 = local_144;
                            if (local_144 != -1) {
                              uVar9 = uVar4;
                              if (iVar6 < local_144) {
                                uVar9 = 0;
                              }
                              iVar28 = (iVar28 - iVar6) + local_144 + 1 + uVar9;
                              local_144 = (local_144 + 1) % (int)uVar4;
                            }
                            if (iVar11 == -1) {
                              bVar12 = 1;
                              goto LAB_0041becc;
                            }
                          }
                        }
                        bVar12 = (int)uVar4 <= iVar28;
                      } while (iVar28 < (int)uVar4);
                    }
                    bVar12 = bVar12 & 1;
LAB_0041becc:
                    iVar28 = (int)local_d0 + 1;
                    pOVar16 = local_120;
                  }
                } while (bVar12 == 0);
                F = local_d8;
                if (bVar12 == 6) {
LAB_0041bf02:
                  F = local_d8;
                  if (iVar28 < (int)uVar4) {
                    if (0 < local_f8.m_count) {
                      piVar7 = (pOVar16->m_ti).m_a;
                      lVar15 = 0;
                      do {
                        if (0 < local_f8.m_a[lVar15].m_count) {
                          piVar8 = local_f8.m_a[lVar15].m_a;
                          lVar26 = 0;
                          do {
                            piVar8[lVar26] = piVar7[piVar8[lVar26]];
                            lVar26 = lVar26 + 1;
                          } while (lVar26 < local_f8.m_a[lVar15].m_count);
                        }
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < local_f8.m_count);
                    }
                    TVar5 = pOVar16->m_type;
                    if (0 < local_80.m_count) {
                      lVar15 = 0;
                      do {
                        iVar28 = local_80.m_a[lVar15];
                        pOVar30 = (local_140->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                  super_ON_ClassArray<ON_BrepTrim>.m_a;
                        pOVar30[iVar28].m_li = -1;
                        ON_Brep::DeleteTrim(local_140,pOVar30 + iVar28,true);
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < local_80.m_count);
                    }
                    if (-1 < (local_120->m_ti).m_capacity) {
                      (local_120->m_ti).m_count = 0;
                    }
                    ON_Brep::DeleteLoop(local_140,local_120,true);
                    local_c8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                    if (0 < local_f8.m_count) {
                      lVar15 = 0;
                      do {
                        pOVar16 = ON_Brep::NewLoop(local_140,unknown,local_88);
                        pOVar22 = local_f8.m_a + lVar15;
                        ON_SimpleArray<int>::operator=(&pOVar16->m_ti,pOVar22);
                        iVar28 = pOVar22->m_count;
                        if (0 < (long)iVar28) {
                          piVar7 = pOVar22->m_a;
                          pOVar30 = (local_140->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                                    super_ON_ClassArray<ON_BrepTrim>.m_a;
                          iVar6 = pOVar16->m_loop_index;
                          lVar26 = 0;
                          do {
                            pOVar30[piVar7[lVar26]].m_li = iVar6;
                            lVar26 = lVar26 + 1;
                          } while (iVar28 != lVar26);
                        }
                        TVar13 = ON_Brep::ComputeLoopType(local_140,pOVar16);
                        pOVar16->m_type = TVar13;
                        if (TVar13 == outer && TVar5 == outer) {
                          piVar7 = (local_88->m_li).m_a;
                          iVar28 = *piVar7;
                          *piVar7 = pOVar16->m_loop_index;
                          lVar26 = (long)(local_88->m_li).m_count;
                          do {
                            if (lVar26 < 2) goto LAB_0041c09b;
                            lVar1 = lVar26 + -1;
                            lVar10 = lVar26 + -1;
                            lVar26 = lVar1;
                          } while (piVar7[lVar10] != pOVar16->m_loop_index);
                          piVar7[lVar1] = iVar28;
                        }
LAB_0041c09b:
                        ON_Brep::MatchTrimEnds(local_140,pOVar16);
                        (*(local_140->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x27])
                                  (local_140,pOVar16,1);
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < local_f8.m_count);
                    }
                  }
                }
                ON_ClassArray<ON_SimpleArray<int>_>::~ON_ClassArray(&local_f8);
                ON_SimpleArray<bool>::~ON_SimpleArray((ON_SimpleArray<bool> *)local_138);
              }
            }
            else {
              local_c8 = CONCAT71((int7)(uVar24 >> 8),1);
              ON_Brep::DeleteLoop(local_140,local_120,true);
              F = local_d8;
            }
            ON_SimpleArray<int>::~ON_SimpleArray(&local_80);
            ON_SimpleArray<bool>::~ON_SimpleArray(&local_68);
          }
        }
        local_c0 = local_c0 + 1;
      } while (local_c0 != local_40);
      bVar12 = (byte)local_c8;
    }
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool ON_BrepRemoveSlits(ON_BrepFace& F)

{
  //For each loop, look for slit pairs that fall between non slits and 
  //break the loop at the pair.
  //After all loops have been split, call ON_Brep::RemoveSlits() on the result.

  if (F.m_face_index < 0)
    return false;
  ON_Brep* pB = F.Brep();
  if (!pB)
    return false;
  bool rc = false;
  int loop_count = F.m_li.Count();
  int i;
  for (i=0; i<loop_count; i++){
    ON_BrepLoop& L = pB->m_L[F.m_li[i]];
    if (L.m_loop_index < 0)
      continue;
    if (ON_BrepRemoveSlits(L))
      rc = true;
  }
  return rc;
}